

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O2

handle_model_result *
common_params_handle_model
          (handle_model_result *__return_storage_ptr__,common_params_model *model,
          string *bearer_token,string *model_path_default)

{
  string *psVar1;
  string *__rhs;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  __type_conflict1 _Var5;
  ushort uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  _Result<bool> *p_Var11;
  common_log *pcVar12;
  invalid_argument *this;
  runtime_error *prVar13;
  _State_baseV2 *__tmp_1;
  _Alloc_hider this_00;
  uint uVar14;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar15;
  _State_baseV2 *__tmp;
  _Alloc_hider __args_1;
  uint uVar16;
  char *fmt;
  common_params_model *local_31f8;
  curl_slist_ptr http_headers;
  string ggufFile;
  curl_ptr curl;
  regex pattern;
  smatch match;
  string mmprojFile;
  long res_code;
  string url;
  string model_endpoint_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string_type local_30b8;
  string hf_repo;
  string res_str;
  string tag;
  string model_endpoint;
  string local_1018 [8];
  size_type local_1010;
  string local_ff8 [8];
  size_type local_ff0;
  
  handle_model_result::handle_model_result(__return_storage_ptr__);
  if ((model->hf_repo)._M_string_length == 0) {
    sVar2 = (model->path)._M_string_length;
    if ((model->url)._M_string_length == 0) {
      if (sVar2 == 0) {
        std::__cxx11::string::_M_assign((string *)model);
      }
    }
    else if (sVar2 == 0) {
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&tag,&model->url,'#');
      std::__cxx11::string::string((string *)&model_endpoint,(string *)tag._M_dataplus._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tag);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&tag,&model_endpoint,'?');
      std::__cxx11::string::_M_assign((string *)&model_endpoint);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tag);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&hf_repo,&model_endpoint,'/');
      fs_get_cache_file(&tag,(string *)(hf_repo._M_string_length - 0x20));
      std::__cxx11::string::operator=((string *)model,(string *)&tag);
      std::__cxx11::string::~string((string *)&tag);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&hf_repo);
      goto LAB_001414f1;
    }
  }
  else {
    psVar1 = &model->hf_repo;
    __rhs = &model->hf_file;
    if ((model->hf_file)._M_string_length == 0) {
      if ((model->path)._M_string_length == 0) {
        string_split<std::__cxx11::string>(&parts,psVar1,':');
        if ((ulong)((long)parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)parts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tag,"latest",(allocator<char> *)&hf_repo);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&tag,
                     (string *)
                     (parts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1));
        }
        std::__cxx11::string::string
                  ((string *)&hf_repo,
                   (string *)
                   parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        string_split<std::__cxx11::string>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&res_str,&hf_repo,'/');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&res_str);
        if (res_str._M_string_length - (long)res_str._M_dataplus._M_p != 0x40) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this,"error: invalid HF repo format, expected <user>/<model>[:quant]\n");
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
        curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
        _M_head_impl = (void *)curl_easy_init();
        http_headers.ptr = (curl_slist *)0x0;
        curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
        super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
             (_Head_base<1UL,_void_(*)(void_*),_false>)curl_easy_cleanup;
        res_str._M_dataplus._M_p = (pointer)&res_str.field_2;
        res_str._M_string_length = 0;
        res_str.field_2._M_allocated_capacity =
             res_str.field_2._M_allocated_capacity & 0xffffffffffffff00;
        get_model_endpoint_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pattern
                       ,&model_endpoint_1,"v2/");
        std::operator+(&mmprojFile,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pattern
                       ,&hf_repo);
        std::operator+(&ggufFile,&mmprojFile,"/manifests/");
        std::operator+(&url,&ggufFile,&tag);
        std::__cxx11::string::~string((string *)&ggufFile);
        std::__cxx11::string::~string((string *)&mmprojFile);
        std::__cxx11::string::~string((string *)&pattern);
        curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2712,
                         url._M_dataplus._M_p);
        curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2b,1);
        curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_void_*,_false>._M_head_impl,0x4e2b,
                         common_get_hf_file::anon_class_1_0_00000001::__invoke);
        curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2711,&res_str);
        if (bearer_token->_M_string_length != 0) {
          std::operator+(&ggufFile,"Authorization: Bearer ",bearer_token);
          http_headers.ptr =
               (curl_slist *)curl_slist_append(http_headers.ptr,ggufFile._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&ggufFile);
        }
        http_headers.ptr = (curl_slist *)curl_slist_append(http_headers.ptr,"User-Agent: llama-cpp")
        ;
        http_headers.ptr =
             (curl_slist *)curl_slist_append(http_headers.ptr,"Accept: application/json");
        curl_easy_setopt(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_void_*,_false>._M_head_impl,0x2727,http_headers.ptr);
        iVar7 = curl_easy_perform(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_void_*,_false>._M_head_impl);
        if (iVar7 != 0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar13,"error: cannot make GET request to HF API");
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ggufFile,"",(allocator<char> *)&mmprojFile);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&mmprojFile,"",(allocator<char> *)&pattern);
        curl_easy_getinfo(curl._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                          super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                          super__Head_base<0UL,_void_*,_false>._M_head_impl,0x200002,&res_code);
        if (res_code != 200) {
          if (res_code != 0x191) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            string_format_abi_cxx11_
                      ((string *)&pattern,"error from HF API, response code: %ld, data: %s",res_code
                       ,res_str._M_dataplus._M_p);
            std::runtime_error::runtime_error(prVar13,(string *)&pattern);
            __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar13,
                     "error: model is private or does not exist; if you are accessing a gated model, please provide a valid HF token"
                    );
LAB_00141bb8:
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&pattern,"\"ggufFile\"[\\s\\S]*?\"rfilename\"\\s*:\\s*\"([^\"]+)\"",0x10);
        match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        match._M_begin._M_current = (char *)0x0;
        match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar4 = std::
                regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (&res_str,&match,&pattern,0);
        if (bVar4) {
          lVar8 = (long)match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar8 == 0) || (0xfffffffffffffffd < lVar8 / 0x18 - 5U)) {
            psVar15 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)match.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x48);
          }
          else {
            psVar15 = match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_30b8,psVar15);
          std::__cxx11::string::operator=((string *)&ggufFile,(string *)&local_30b8);
          std::__cxx11::string::~string((string *)&local_30b8);
        }
        std::
        _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&match);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&pattern,"\"mmprojFile\"[\\s\\S]*?\"rfilename\"\\s*:\\s*\"([^\"]+)\"",0x10);
        match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        match._M_begin._M_current = (char *)0x0;
        match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar4 = std::
                regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (&res_str,&match,&pattern,0);
        if (bVar4) {
          lVar8 = (long)match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar8 == 0) || (0xfffffffffffffffd < lVar8 / 0x18 - 5U)) {
            psVar15 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)match.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x48);
          }
          else {
            psVar15 = match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_30b8,psVar15);
          std::__cxx11::string::operator=((string *)&mmprojFile,(string *)&local_30b8);
          std::__cxx11::string::~string((string *)&local_30b8);
        }
        std::
        _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&match);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
        if (ggufFile._M_string_length == 0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar13,"error: model does not have ggufFile");
          goto LAB_00141bb8;
        }
        std::__cxx11::string::string((string *)&model_endpoint,(string *)&hf_repo);
        std::__cxx11::string::string(local_1018,(string *)&ggufFile);
        std::__cxx11::string::string(local_ff8,(string *)&mmprojFile);
        std::__cxx11::string::~string((string *)&mmprojFile);
        std::__cxx11::string::~string((string *)&ggufFile);
        std::__cxx11::string::~string((string *)&url);
        std::__cxx11::string::~string((string *)&model_endpoint_1);
        std::__cxx11::string::~string((string *)&res_str);
        curl_slist_ptr::~curl_slist_ptr(&http_headers);
        std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr(&curl);
        std::__cxx11::string::~string((string *)&hf_repo);
        std::__cxx11::string::~string((string *)&tag);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parts);
        if ((model_endpoint._M_string_length == 0) || (local_1010 == 0)) goto LAB_00141ab1;
        std::__cxx11::string::_M_assign((string *)psVar1);
        std::__cxx11::string::_M_assign((string *)__rhs);
        if (local_ff0 != 0) {
          __return_storage_ptr__->found_mmproj = true;
          std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->mmproj).hf_repo);
          std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->mmproj).hf_file);
        }
        common_hf_file_res::~common_hf_file_res((common_hf_file_res *)&model_endpoint);
      }
      else {
        std::__cxx11::string::_M_assign((string *)__rhs);
      }
    }
    get_model_endpoint_abi_cxx11_();
    std::operator+(&res_str,&model_endpoint,psVar1);
    std::operator+(&hf_repo,&res_str,"/resolve/main/");
    std::operator+(&tag,&hf_repo,__rhs);
    std::__cxx11::string::operator=((string *)&model->url,(string *)&tag);
    std::__cxx11::string::~string((string *)&tag);
    std::__cxx11::string::~string((string *)&hf_repo);
    std::__cxx11::string::~string((string *)&res_str);
    if ((model->path)._M_string_length == 0) {
      std::operator+(&hf_repo,psVar1,"_");
      std::operator+(&tag,&hf_repo,__rhs);
      std::__cxx11::string::~string((string *)&hf_repo);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hf_repo,"/",(allocator<char> *)&model_endpoint_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res_str,"_",(allocator<char> *)&url);
      string_replace_all(&tag,&hf_repo,&res_str);
      std::__cxx11::string::~string((string *)&res_str);
      std::__cxx11::string::~string((string *)&hf_repo);
      fs_get_cache_file(&hf_repo,&tag);
      std::__cxx11::string::operator=((string *)model,(string *)&hf_repo);
      std::__cxx11::string::~string((string *)&hf_repo);
      std::__cxx11::string::~string((string *)&tag);
    }
LAB_001414f1:
    std::__cxx11::string::~string((string *)&model_endpoint);
  }
  if ((model->url)._M_string_length == 0) {
    return __return_storage_ptr__;
  }
  psVar1 = &model->url;
  bVar4 = common_download_file_single(psVar1,&model->path,bearer_token);
  if (bVar4) {
    uVar16 = 1;
    lVar8 = gguf_init_from_file((model->path)._M_dataplus._M_p,1,0);
    if (lVar8 == 0) {
      if (common_log_verbosity_thold < 0) goto LAB_00141ab1;
      pcVar12 = common_log_main();
      common_log_add(pcVar12,GGML_LOG_LEVEL_ERROR,"\n%s:  failed to load input GGUF from %s\n",
                     "common_download_model",(model->path)._M_dataplus._M_p);
    }
    else {
      lVar9 = gguf_find_key(lVar8);
      if (lVar9 < 0) {
        uVar14 = 0;
      }
      else {
        uVar6 = gguf_get_val_u16(lVar8);
        uVar14 = (uint)uVar6;
      }
      gguf_free(lVar8);
      if (uVar14 < 2) {
        return __return_storage_ptr__;
      }
      memset(&model_endpoint,0,0x1000);
      memset(&hf_repo,0,0x824);
      iVar7 = llama_split_prefix(&model_endpoint,0x1000,(model->path)._M_dataplus._M_p,0,uVar14);
      if (iVar7 == 0) {
        if (-1 < common_log_verbosity_thold) {
          fmt = "\n%s: unexpected model file name: %s n_split=%d\n";
          local_31f8 = model;
          goto LAB_00141a63;
        }
      }
      else {
        iVar7 = llama_split_prefix(&hf_repo,0x824,(psVar1->_M_dataplus)._M_p,0,uVar14);
        if (iVar7 != 0) {
          url.field_2._M_allocated_capacity = 0;
          url._M_dataplus._M_p = (pointer)0x0;
          url._M_string_length = 0;
          for (; sVar2 = url._M_string_length, uVar14 != uVar16; uVar16 = uVar16 + 1) {
            memset(&tag,0,0x1000);
            llama_split_path(&tag,0x1000,&model_endpoint,uVar16,uVar14);
            memset(&res_str,0,0x824);
            llama_split_path(&res_str,0x824,&hf_repo,uVar16,uVar14);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&model_endpoint_1,(char *)&tag,(allocator<char> *)&ggufFile);
            _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&model_endpoint_1,&model->path);
            std::__cxx11::string::~string((string *)&model_endpoint_1);
            if (!_Var5) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<char_(&)[2084],_char_(&)[4096],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&model_endpoint_1,(char (*) [2084])&res_str,(char (*) [4096])&tag);
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&url,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&model_endpoint_1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&model_endpoint_1);
            }
          }
          res_str._M_dataplus._M_p = (pointer)0x0;
          res_str._M_string_length = 0;
          res_str.field_2._M_allocated_capacity = 0;
          for (__args_1._M_p = url._M_dataplus._M_p; sVar3 = res_str._M_string_length,
              this_00._M_p = res_str._M_dataplus._M_p, __args_1._M_p != (pointer)sVar2;
              __args_1._M_p = __args_1._M_p + 0x40) {
            std::__cxx11::string::string((string *)&tag,(string *)bearer_token);
            ggufFile._M_dataplus._M_p = (pointer)0x0;
            ggufFile._M_string_length = 0;
            puVar10 = (undefined8 *)operator_new(0xa8);
            model_endpoint_1._M_dataplus._M_p = (pointer)&parts;
            puVar10[1] = 0x100000001;
            *puVar10 = &PTR___Sp_counted_ptr_inplace_0022aab8;
            puVar10[3] = 0;
            *(undefined4 *)(puVar10 + 4) = 0;
            *(undefined1 *)((long)puVar10 + 0x24) = 0;
            *(undefined4 *)(puVar10 + 5) = 0;
            puVar10[6] = 0;
            *(undefined4 *)(puVar10 + 7) = 0;
            puVar10[2] = &PTR___Async_state_impl_0022ab08;
            model_endpoint_1._M_string_length = (size_type)puVar10;
            p_Var11 = (_Result<bool> *)operator_new(0x18);
            std::__future_base::_Result<bool>::_Result(p_Var11);
            puVar10[8] = p_Var11;
            std::thread::
            _Invoker<std::tuple<common_download_file_multiple(std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>const&,std::__cxx11::string_const&)::$_0,std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::
            _Invoker<common_download_file_multiple(std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>const&,std::__cxx11::string_const&)::__0,std::pair<std::__cxx11::string,std::__cxx11::string>const&>
                      ((_Invoker<std::tuple<common_download_file_multiple(std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>const&,std::__cxx11::string_const&)::__0,std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)(puVar10 + 9),(type *)&tag,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)__args_1._M_p);
            local_30b8._M_dataplus._M_p = (pointer)0x0;
            match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
            ((match.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).first._M_current = (char *)&PTR___State_0022ab60;
            ((match.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).second._M_current = (char *)(puVar10 + 2);
            *(code **)&(match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->matched =
                 std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/arg.cpp:441:67),_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
                 ::_M_run;
            match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .first._M_current = (char *)0x0;
            std::thread::_M_start_thread(&local_30b8,&match,0);
            if (match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)(((match.
                             super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).first._M_current + 8))();
            }
            std::thread::operator=((thread *)(puVar10 + 6),(thread *)&local_30b8);
            std::thread::~thread((thread *)&local_30b8);
            model_endpoint_1._M_string_length = 0;
            std::
            __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/arg.cpp:441:67),_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/arg.cpp:441:67),_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
            ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_common_arg_cpp:441:67),_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_common_arg_cpp:441:67),_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                                *)&model_endpoint_1);
            mmprojFile._M_dataplus._M_p = (pointer)0x0;
            mmprojFile._M_string_length = 0;
            model_endpoint_1._M_dataplus = ggufFile._M_dataplus;
            model_endpoint_1._M_string_length = ggufFile._M_string_length;
            ggufFile._M_dataplus._M_p = (pointer)(puVar10 + 2);
            ggufFile._M_string_length = (size_type)puVar10;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &model_endpoint_1._M_string_length);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mmprojFile._M_string_length);
            if (ggufFile._M_dataplus._M_p == (pointer)0x0) {
              puVar10 = (undefined8 *)operator_new(0x98);
              model_endpoint_1._M_dataplus._M_p = (pointer)&match;
              puVar10[1] = 0x100000001;
              *puVar10 = &PTR___Sp_counted_ptr_inplace_0022aba0;
              puVar10[3] = 0;
              *(undefined4 *)(puVar10 + 4) = 0;
              *(undefined1 *)((long)puVar10 + 0x24) = 0;
              *(undefined4 *)(puVar10 + 5) = 0;
              puVar10[2] = &PTR___Deferred_state_0022abf0;
              model_endpoint_1._M_string_length = (size_type)puVar10;
              p_Var11 = (_Result<bool> *)operator_new(0x18);
              std::__future_base::_Result<bool>::_Result(p_Var11);
              puVar10[6] = p_Var11;
              std::thread::
              _Invoker<std::tuple<common_download_file_multiple(std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>const&,std::__cxx11::string_const&)::$_0,std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::
              _Invoker<common_download_file_multiple(std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>const&,std::__cxx11::string_const&)::__0,std::pair<std::__cxx11::string,std::__cxx11::string>const&>
                        ((_Invoker<std::tuple<common_download_file_multiple(std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>const&,std::__cxx11::string_const&)::__0,std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)(puVar10 + 7),(type *)&tag,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)__args_1._M_p);
              model_endpoint_1._M_string_length = 0;
              std::
              __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/arg.cpp:441:67),_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/arg.cpp:441:67),_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
              ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_common_arg_cpp:441:67),_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_common_arg_cpp:441:67),_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                                  *)&model_endpoint_1);
              mmprojFile._M_dataplus._M_p = (pointer)0x0;
              mmprojFile._M_string_length = 0;
              model_endpoint_1._M_dataplus = ggufFile._M_dataplus;
              model_endpoint_1._M_string_length = ggufFile._M_string_length;
              ggufFile._M_dataplus._M_p = (pointer)(puVar10 + 2);
              ggufFile._M_string_length = (size_type)puVar10;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &model_endpoint_1._M_string_length);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mmprojFile._M_string_length)
              ;
            }
            std::__basic_future<bool>::__basic_future
                      ((__basic_future<bool> *)&pattern,(__state_type *)&ggufFile);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ggufFile._M_string_length);
            std::vector<std::future<bool>,std::allocator<std::future<bool>>>::
            emplace_back<std::future<bool>>
                      ((vector<std::future<bool>,std::allocator<std::future<bool>>> *)&res_str,
                       (future<bool> *)&pattern);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pattern._M_loc);
            std::__cxx11::string::~string((string *)&tag);
          }
          do {
            if (this_00._M_p == (pointer)sVar3) break;
            bVar4 = std::future<bool>::get((future<bool> *)this_00._M_p);
            this_00._M_p = (pointer)((long)this_00._M_p + 0x10);
          } while (bVar4);
          std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector
                    ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)&res_str);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&url);
          return __return_storage_ptr__;
        }
        if (-1 < common_log_verbosity_thold) {
          fmt = "\n%s: unexpected model url: %s n_split=%d\n";
          local_31f8 = (common_params_model *)psVar1;
LAB_00141a63:
          pcVar12 = common_log_main();
          common_log_add(pcVar12,GGML_LOG_LEVEL_ERROR,fmt,"common_download_model",
                         (local_31f8->path)._M_dataplus._M_p,(ulong)uVar14);
        }
      }
    }
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar12 = common_log_main();
    common_log_add(pcVar12,GGML_LOG_LEVEL_ERROR,"error: failed to download model from %s\n",
                   (psVar1->_M_dataplus)._M_p);
  }
LAB_00141ab1:
  exit(1);
}

Assistant:

static handle_model_result common_params_handle_model(
        struct common_params_model & model,
        const std::string & bearer_token,
        const std::string & model_path_default) {
    handle_model_result result;
    // handle pre-fill default model path and url based on hf_repo and hf_file
    {
        if (!model.hf_repo.empty()) {
            // short-hand to avoid specifying --hf-file -> default it to --model
            if (model.hf_file.empty()) {
                if (model.path.empty()) {
                    auto auto_detected = common_get_hf_file(model.hf_repo, bearer_token);
                    if (auto_detected.repo.empty() || auto_detected.ggufFile.empty()) {
                        exit(1); // built without CURL, error message already printed
                    }
                    model.hf_repo = auto_detected.repo;
                    model.hf_file = auto_detected.ggufFile;
                    if (!auto_detected.mmprojFile.empty()) {
                        result.found_mmproj   = true;
                        result.mmproj.hf_repo = model.hf_repo;
                        result.mmproj.hf_file = auto_detected.mmprojFile;
                    }
                } else {
                    model.hf_file = model.path;
                }
            }

            std::string model_endpoint = get_model_endpoint();
            model.url = model_endpoint + model.hf_repo + "/resolve/main/" + model.hf_file;
            // make sure model path is present (for caching purposes)
            if (model.path.empty()) {
                // this is to avoid different repo having same file name, or same file name in different subdirs
                std::string filename = model.hf_repo + "_" + model.hf_file;
                // to make sure we don't have any slashes in the filename
                string_replace_all(filename, "/", "_");
                model.path = fs_get_cache_file(filename);
            }

        } else if (!model.url.empty()) {
            if (model.path.empty()) {
                auto f = string_split<std::string>(model.url, '#').front();
                f = string_split<std::string>(f, '?').front();
                model.path = fs_get_cache_file(string_split<std::string>(f, '/').back());
            }

        } else if (model.path.empty()) {
            model.path = model_path_default;
        }
    }

    // then, download it if needed
    if (!model.url.empty()) {
        bool ok = common_download_model(model, bearer_token);
        if (!ok) {
            LOG_ERR("error: failed to download model from %s\n", model.url.c_str());
            exit(1);
        }
    }

    return result;
}